

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secure.h
# Opt level: O0

RNGState * __thiscall
secure_allocator<(anonymous_namespace)::RNGState>::allocate
          (secure_allocator<(anonymous_namespace)::RNGState> *this,size_t n)

{
  long lVar1;
  RNGState *pRVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  RNGState *allocation;
  bad_alloc *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LockedPoolManager::Instance();
  pRVar2 = (RNGState *)LockedPool::alloc((LockedPool *)this,n);
  if (pRVar2 == (RNGState *)0x0) {
    uVar3 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffffc8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pRVar2;
  }
  __stack_chk_fail();
}

Assistant:

T* allocate(std::size_t n)
    {
        T* allocation = static_cast<T*>(LockedPoolManager::Instance().alloc(sizeof(T) * n));
        if (!allocation) {
            throw std::bad_alloc();
        }
        return allocation;
    }